

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void deferred_on_data(void *uuid,void *arg2)

{
  undefined1 *puVar1;
  char cVar2;
  undefined8 *puVar3;
  fio_defer_task_s task;
  int __epfd;
  fio_data_s *pfVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  long lVar10;
  fio_lock_i ret;
  undefined1 local_5c [20];
  code *local_48;
  void *pvStack_40;
  undefined8 local_38;
  
  iVar6 = fio_is_closed((intptr_t)uuid);
  pfVar4 = fio_data;
  if (iVar6 != 0) {
    return;
  }
  iVar6 = (int)((ulong)uuid >> 8);
  lVar10 = (long)iVar6 * 0xa8;
  if (*(long *)((long)fio_data + lVar10 + 0x58) == 0) {
    deferred_on_ready(uuid,arg2);
    return;
  }
  piVar8 = __errno_location();
  *piVar8 = 0;
  LOCK();
  pcVar9 = (char *)((long)pfVar4 + lVar10 + 0x6c);
  cVar2 = *pcVar9;
  *pcVar9 = '\x01';
  UNLOCK();
  if (cVar2 == '\0') {
    puVar3 = *(undefined8 **)((long)fio_data + lVar10 + 0x58);
    if (puVar3 == (undefined8 *)0x0) {
      LOCK();
      *(undefined1 *)((long)fio_data + lVar10 + 0x6c) = 0;
      UNLOCK();
      *piVar8 = 9;
      return;
    }
    LOCK();
    cVar2 = *(char *)(puVar3 + 5);
    *(char *)(puVar3 + 5) = '\x01';
    UNLOCK();
    pcVar9 = (char *)((long)fio_data + lVar10 + 0x6c);
    local_5c._12_8_ = piVar8;
    if (cVar2 == '\0') {
      LOCK();
      *pcVar9 = '\0';
      UNLOCK();
      LOCK();
      puVar1 = (undefined1 *)((long)fio_data + lVar10 + 0x6b);
      local_5c[0] = *puVar1;
      *puVar1 = 0;
      UNLOCK();
      (*(code *)*puVar3)(uuid,puVar3);
      uVar5 = local_5c._12_8_;
      LOCK();
      *(undefined1 *)(puVar3 + 5) = 0;
      UNLOCK();
      LOCK();
      pcVar9 = (char *)((long)fio_data + lVar10 + 0x6b);
      cVar2 = *pcVar9;
      *pcVar9 = '\x01';
      __epfd = evio_fd[1];
      UNLOCK();
      if (cVar2 != '\0') {
        return;
      }
      do {
        *(int *)uVar5 = 0;
        local_5c._0_4_ = 0x40002011;
        local_5c._4_4_ = iVar6;
        iVar7 = epoll_ctl(__epfd,3,iVar6,(epoll_event *)local_5c);
        if (iVar7 == -1) {
          iVar7 = *(int *)uVar5;
          if (iVar7 == 2) {
            *(int *)uVar5 = 0;
            local_5c._0_4_ = 0x40002011;
            local_5c._4_4_ = iVar6;
            epoll_ctl(__epfd,1,iVar6,(epoll_event *)local_5c);
            goto LAB_001073d2;
          }
        }
        else {
LAB_001073d2:
          iVar7 = *(int *)uVar5;
        }
        if (iVar7 != 4) {
          return;
        }
      } while( true );
    }
    LOCK();
    cVar2 = *pcVar9;
    *pcVar9 = '\0';
    UNLOCK();
  }
  local_5c[0] = cVar2;
  *piVar8 = 0xb;
  if (arg2 != (void *)0x0) {
    local_48 = deferred_on_data;
    local_38 = 1;
    task.arg1 = uuid;
    task.func = deferred_on_data;
    task.arg2 = &DAT_00000001;
    pvStack_40 = uuid;
    fio_defer_push_task_fn(task,&task_queue_normal);
    return;
  }
  fio_poll_add_read((long)iVar6);
  return;
}

Assistant:

static void deferred_on_data(void *uuid, void *arg2) {
  if (fio_is_closed((intptr_t)uuid)) {
    return;
  }
  if (!uuid_data(uuid).protocol)
    goto no_protocol;
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(uuid), FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF) {
      return;
    }
    goto postpone;
  }
  fio_unlock(&uuid_data(uuid).scheduled);
  pr->on_data((intptr_t)uuid, pr);
  protocol_unlock(pr, FIO_PR_LOCK_TASK);
  if (!fio_trylock(&uuid_data(uuid).scheduled)) {
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

postpone:
  if (arg2) {
    /* the event is being forced, so force rescheduling */
    fio_defer_push_task(deferred_on_data, (void *)uuid, (void *)1);
  } else {
    /* the protocol was locked, so there might not be any need for the event */
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

no_protocol:
  /* a missing protocol might still want to invoke the RW hook flush */
  deferred_on_ready(uuid, arg2);
  return;
}